

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

void Test24(void)

{
  CMReturn In;
  long lVar1;
  string in;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  CMReturn res;
  ConfusableMatcher matcher;
  long *local_2130;
  long local_2128;
  long local_2120 [2];
  undefined4 local_2110;
  undefined4 uStack_210c;
  long lStack_2108;
  undefined4 local_2100;
  undefined4 uStack_20fc;
  undefined8 uStack_20f8;
  undefined8 local_20f0;
  undefined8 uStack_20e8;
  _Alloc_hider local_20e0;
  char local_20d0 [8];
  undefined8 in_stack_ffffffffffffdf38;
  _Alloc_hider Start;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a0;
  undefined1 in_stack_ffffffffffffdf80 [16];
  uint64_t in_stack_ffffffffffffdf90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2058;
  ConfusableMatcher local_2020;
  
  GetDefaultMap_abi_cxx11_();
  local_2130 = local_2120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2130,"DASD","");
  lVar1 = local_2128;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20a0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&stack0xffffffffffffdf78);
  local_2058._M_buckets = &local_2058._M_single_bucket;
  local_2058._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2058._M_element_count = 0;
  local_2058._M_bucket_count = 1;
  local_2058._M_rehash_policy._M_max_load_factor = 1.0;
  local_2058._M_rehash_policy._4_4_ = 0;
  local_2058._M_rehash_policy._M_next_resize = 0;
  local_2058._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&local_2020,&local_20a0,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2058,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2058);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20a0);
  Start._M_p = (pointer)&local_20b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffdf40,local_2130,local_2128 + (long)local_2130);
  local_20e0._M_p = local_20d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_20e0,"D","");
  lStack_2108 = lVar1 + -1;
  local_2110 = 1;
  uStack_210c = 0;
  local_2100 = 1;
  uStack_20fc = 0;
  uStack_20f8 = 1000000;
  local_20f0 = 0;
  uStack_20e8 = 0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)&stack0xffffffffffffdf90,&local_2020,(string *)&stack0xffffffffffffdf40,
             (string *)&local_20e0,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,CONCAT420(0,CONCAT416(1,CONCAT88(lStack_2108,1))))));
  if (local_20e0._M_p != local_20d0) {
    operator_delete(local_20e0._M_p,(long)local_20d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Start._M_p != &local_20b0) {
    operator_delete(Start._M_p,local_20b0._M_allocated_capacity + 1);
  }
  In._16_8_ = in_stack_ffffffffffffdf90;
  In.Start = in_stack_ffffffffffffdf80._0_8_;
  In.Size = in_stack_ffffffffffffdf80._8_8_;
  AssertMatch(In,(size_t)Start._M_p,in_stack_ffffffffffffdf38);
  ConfusableMatcher::~ConfusableMatcher(&local_2020);
  if (local_2130 != local_2120) {
    operator_delete(local_2130,local_2120[0] + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffdf78);
  return;
}

Assistant:

void Test24()
{
	auto map = GetDefaultMap();

	std::string in = "DASD";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	opts.StartIndex = in.size() - 1;
	opts.StartFromEnd = true;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "D", opts);
	AssertMatch(res, 3, 1);
}